

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<wchar_t> * __thiscall asl::Array<wchar_t>::reserve(Array<wchar_t> *this,int m)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  void *pvVar5;
  undefined8 *puVar6;
  int __fd;
  wchar_t wVar7;
  wchar_t *__dest;
  size_t __size;
  
  pwVar4 = this->_a;
  wVar1 = pwVar4[-3];
  if (wVar1 < m) {
    wVar7 = wVar1 * 2;
    if (wVar1 * 2 <= m) {
      wVar7 = m;
    }
    wVar2 = pwVar4[-4];
    if (((long)wVar1 & 0x3ffffffffffffe00U) == 0) {
      pvVar5 = malloc((long)wVar7 * 4 + 0x10);
      if (pvVar5 == (void *)0x0) goto LAB_001356ca;
      __dest = (wchar_t *)((long)pvVar5 + 0x10);
      if (wVar2 <= m) {
        m = wVar2;
      }
      memcpy(__dest,pwVar4,(long)(m << 2));
      __fd = (int)pwVar4;
    }
    else {
      dup(this,m);
      wVar3 = this->_a[-2];
      __size = (long)wVar7 * 4 + 0x10;
      pwVar4 = (wchar_t *)realloc(this->_a + -4,__size);
      __fd = (int)__size;
      if (pwVar4 == (wchar_t *)0x0) {
LAB_001356ca:
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = dup2;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      __dest = pwVar4 + 4;
      this->_a = __dest;
      pwVar4[2] = wVar3;
      pwVar4[1] = wVar7;
      *pwVar4 = wVar2;
      wVar7 = wVar1;
    }
    if (wVar7 != wVar1) {
      dup(this,__fd);
      wVar1 = this->_a[-2];
      free(this->_a + -4);
      this->_a = __dest;
      __dest[-2] = wVar1;
      __dest[-3] = wVar7;
      __dest[-4] = wVar2;
    }
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}